

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O3

void strbuf_append_string(strbuf_t *s,char *str)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  
  cVar2 = *str;
  if (cVar2 != '\0') {
    uVar4 = s->length;
    iVar1 = ~uVar4 + s->size;
    pcVar3 = str + 1;
    do {
      if (iVar1 < 1) {
        strbuf_resize(s,uVar4 + 1);
        uVar4 = s->length;
        iVar1 = ~uVar4 + s->size;
        cVar2 = pcVar3[-1];
      }
      s->buf[(int)uVar4] = cVar2;
      uVar4 = s->length + 1;
      s->length = uVar4;
      iVar1 = iVar1 + -1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void strbuf_append_string(strbuf_t *s, const char *str)
{
    int space, i;

    space = strbuf_empty_length(s);

    for (i = 0; str[i]; i++) {
        if (space < 1) {
            strbuf_resize(s, s->length + 1);
            space = strbuf_empty_length(s);
        }

        s->buf[s->length] = str[i];
        s->length++;
        space--;
    }
}